

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O3

void __thiscall
llvm::ScopedPrinter::printBinaryImpl
          (ScopedPrinter *this,StringRef Label,StringRef Str,ArrayRef<unsigned_char> Data,bool Block
          ,uint32_t StartOffset)

{
  size_t sVar1;
  raw_ostream *prVar2;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  FormattedBytes local_78;
  size_type local_48;
  size_t local_40;
  char *local_38;
  
  local_40 = Str.Length;
  local_38 = Str.Data;
  local_48 = Data.Length;
  printIndent(this);
  prVar2 = raw_ostream::operator<<(this->OS,Label);
  sVar1 = local_40;
  if (Data.Length < 0x11 && !Block) {
    Str_04.Length = 1;
    Str_04.Data = ":";
    raw_ostream::operator<<(prVar2,Str_04);
    sVar1 = local_40;
    if (local_40 != 0) {
      Str_05.Length = 1;
      Str_05.Data = " ";
      prVar2 = raw_ostream::operator<<(this->OS,Str_05);
      Str_06.Length = sVar1;
      Str_06.Data = local_38;
      raw_ostream::operator<<(prVar2,Str_06);
    }
    Str_07.Length = 2;
    Str_07.Data = " (";
    prVar2 = raw_ostream::operator<<(this->OS,Str_07);
    local_78.Bytes.Data = Data.Data;
    local_78.Bytes.Length = local_48;
    local_78.FirstByteOffset.Storage.field_0.value = 0;
    local_78.FirstByteOffset.Storage.hasVal = false;
    local_78.IndentLevel = 0;
    local_78.NumPerLine = (uint32_t)local_48;
    local_78.ByteGroupSize = '\x01';
    local_78.Upper = true;
    local_78.ASCII = false;
    if (local_48 == 0) {
      local_78.ByteGroupSize = '\0';
      local_78.Upper = true;
    }
    prVar2 = raw_ostream::operator<<(prVar2,&local_78);
  }
  else {
    if (local_40 != 0) {
      Str_00.Length = 2;
      Str_00.Data = ": ";
      prVar2 = raw_ostream::operator<<(this->OS,Str_00);
      Str_01.Length = sVar1;
      Str_01.Data = local_38;
      raw_ostream::operator<<(prVar2,Str_01);
    }
    Str_02.Length = 3;
    Str_02.Data = " (\n";
    raw_ostream::operator<<(this->OS,Str_02);
    if (local_48 != 0) {
      local_78.FirstByteOffset.Storage.field_0.value._4_4_ = 0;
      local_78.FirstByteOffset.Storage.field_0.value._0_4_ = StartOffset;
      local_78.IndentLevel = this->IndentLevel * 2 + 2;
      local_78.Bytes.Data = Data.Data;
      local_78.Bytes.Length = local_48;
      local_78.FirstByteOffset.Storage.hasVal = true;
      local_78.NumPerLine = 0x10;
      local_78.ByteGroupSize = '\x04';
      local_78.Upper = true;
      local_78.ASCII = true;
      prVar2 = raw_ostream::operator<<(this->OS,&local_78);
      Str_03.Length = 1;
      Str_03.Data = "\n";
      raw_ostream::operator<<(prVar2,Str_03);
    }
    printIndent(this);
    prVar2 = this->OS;
  }
  Str_08.Length = 2;
  Str_08.Data = ")\n";
  raw_ostream::operator<<(prVar2,Str_08);
  return;
}

Assistant:

void ScopedPrinter::printBinaryImpl(StringRef Label, StringRef Str,
                                    ArrayRef<uint8_t> Data, bool Block,
                                    uint32_t StartOffset) {
  if (Data.size() > 16)
    Block = true;

  if (Block) {
    startLine() << Label;
    if (!Str.empty())
      OS << ": " << Str;
    OS << " (\n";
    if (!Data.empty())
      OS << format_bytes_with_ascii(Data, StartOffset, 16, 4,
                                    (IndentLevel + 1) * 2, true)
         << "\n";
    startLine() << ")\n";
  } else {
    startLine() << Label << ":";
    if (!Str.empty())
      OS << " " << Str;
    OS << " (" << format_bytes(Data, None, Data.size(), 1, 0, true) << ")\n";
  }
}